

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O3

CTcStreamAnchor * __thiscall
CTcDataStream::add_anchor
          (CTcDataStream *this,CTcSymbol *owner_sym,CTcAbsFixup **fixup_list_head,ulong ofs)

{
  CTcStreamAnchor *pCVar1;
  CTcStreamAnchor *pCVar2;
  
  pCVar1 = (CTcStreamAnchor *)CTcPrsMem::alloc(this->allocator_,0x30);
  pCVar1->nxt_ = (CTcStreamAnchor *)0x0;
  if (fixup_list_head == (CTcAbsFixup **)0x0) {
    pCVar1->fixup_list_head_ = (CTcAbsFixup **)&pCVar1->fixup_info_;
    (pCVar1->fixup_info_).internal_fixup_head_ = (CTcAbsFixup *)0x0;
  }
  else {
    pCVar1->fixup_list_head_ = fixup_list_head;
    (pCVar1->fixup_info_).fixup_owner_sym_ = owner_sym;
  }
  pCVar1->ofs_ = ofs;
  pCVar1->addr_ = 0;
  pCVar1->field_0x28 = pCVar1->field_0x28 & 0xfe;
  pCVar2 = (CTcStreamAnchor *)&this->first_anchor_;
  if (this->last_anchor_ != (CTcStreamAnchor *)0x0) {
    pCVar2 = this->last_anchor_;
  }
  pCVar2->nxt_ = pCVar1;
  this->last_anchor_ = pCVar1;
  return pCVar1;
}

Assistant:

CTcStreamAnchor *CTcDataStream::add_anchor(CTcSymbol *owner_sym,
                                           CTcAbsFixup **fixup_list_head,
                                           ulong ofs)
{
    CTcStreamAnchor *anchor;
    
    /* allocate the anchor, giving it our current offset */
    anchor = new (allocator_) CTcStreamAnchor(owner_sym,
                                              fixup_list_head, ofs);

    /* append it to our list */
    if (last_anchor_ != 0)
        last_anchor_->nxt_ = anchor;
    else
        first_anchor_ = anchor;
    last_anchor_ = anchor;

    /* return the new anchor */
    return anchor;
}